

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool cfd::core::ScriptOperator::IsOpSuccess(ScriptType op_code,bool is_elements)

{
  bool is_elements_local;
  ScriptType op_code_local;
  
  if ((((((op_code == kOpReserved) || (op_code == kOpSuccess98)) ||
        ((0x7d < (int)op_code && ((int)op_code < 0x82)))) ||
       ((0x82 < (int)op_code && ((int)op_code < 0x87)))) ||
      (((0x88 < (int)op_code && ((int)op_code < 0x8b)) ||
       ((((0x8c < (int)op_code && ((int)op_code < 0x8f)) ||
         ((0x94 < (int)op_code && ((int)op_code < 0x9a)))) ||
        ((0xba < (int)op_code && ((int)op_code < 0xc0)))))))) ||
     (((0xc2 < (int)op_code && ((int)op_code < 0xfa)) || (op_code == kOpSuccess252)))) {
    is_elements_local = true;
  }
  else if ((is_elements) ||
          (((((int)op_code < 0xc0 || (0xc2 < (int)op_code)) &&
            (((int)op_code < 0xfa || (0xfb < (int)op_code)))) &&
           (((int)op_code < 0xfd || (0xfe < (int)op_code)))))) {
    is_elements_local = false;
  }
  else {
    is_elements_local = true;
  }
  return is_elements_local;
}

Assistant:

bool ScriptOperator::IsOpSuccess(ScriptType op_code, bool is_elements) {
  if ((op_code == kOpSuccess80) || (op_code == kOpSuccess98) ||
      ((op_code >= kOpSuccess126) && (op_code <= kOpSuccess129)) ||
      ((op_code >= kOpSuccess131) && (op_code <= kOpSuccess134)) ||
      ((op_code >= kOpSuccess137) && (op_code <= kOpSuccess138)) ||
      ((op_code >= kOpSuccess141) && (op_code <= kOpSuccess142)) ||
      ((op_code >= kOpSuccess149) && (op_code <= kOpSuccess153)) ||
      ((op_code >= kOpSuccess187) && (op_code <= kOpSuccess191)) ||
      ((op_code >= kOpSuccess195) && (op_code <= kOpSuccess249)) ||
      (op_code == kOpSuccess252)) {
    return true;
  } else if (!is_elements) {
    if (((op_code >= kOpSuccess192) && (op_code <= kOpSuccess194)) ||
        ((op_code >= kOpSuccess250) && (op_code <= kOpSuccess251)) ||
        ((op_code >= kOpSuccess253) && (op_code <= kOpSuccess254))) {
      return true;
    }
  }
  return false;
}